

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  Tokenizer *pTVar1;
  bool bVar2;
  Message *descriptor;
  char *pcVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  ErrorMaker error;
  int end;
  int start;
  Token start_token;
  LocationRecorder start_location;
  LocationRecorder location;
  int local_c4;
  uint local_c0;
  int local_bc;
  LocationRecorder *local_b8;
  RepeatedPtrFieldBase *local_b0;
  DescriptorProto *local_a8;
  Message *local_a0;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined8 local_70;
  ColumnNumber local_68;
  LocationRecorder local_60;
  LocationRecorder local_48;
  
  local_b0 = &(message->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase;
  local_c0 = (uint)CONCAT71((int7)((ulong)local_b0 >> 8),1);
  local_b8 = parent_location;
  local_a8 = message;
  do {
    LocationRecorder::LocationRecorder(&local_48,local_b8,*(int *)((long)&local_a8->field_0 + 0xa0))
    ;
    descriptor = (Message *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (local_b0,Arena::
                                     DefaultConstruct<google::protobuf::DescriptorProto_ReservedRange>
                           );
    LocationRecorder::RecordLegacyLocation(&local_48,descriptor,NUMBER);
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_a0 = descriptor;
    LocationRecorder::LocationRecorder(&local_60,&local_48,1);
    pTVar1 = this->input_;
    local_98._0_4_ = (pTVar1->current_).type;
    std::__cxx11::string::_M_assign((string *)&local_90);
    local_68 = (pTVar1->current_).end_column;
    local_70._0_4_ = (pTVar1->current_).line;
    local_70._4_4_ = (pTVar1->current_).column;
    pcVar3 = "Expected field number range.";
    if ((local_c0 & 1) != 0) {
      pcVar3 = "Expected field name or number range.";
    }
    error.func_ = (_func_string_void_ptr *)0x0;
    error.field_0.error_ = pcVar3;
    bVar2 = ConsumeInteger(this,&local_bc,error);
    LocationRecorder::~LocationRecorder(&local_60);
    if (bVar2) {
      text._M_str = "to";
      text._M_len = 2;
      bVar2 = TryConsume(this,text);
      if (bVar2) {
        LocationRecorder::LocationRecorder(&local_60,&local_48,2);
        text_00._M_str = "max";
        text_00._M_len = 3;
        bVar2 = TryConsume(this,text_00);
        if (bVar2) {
          local_c4 = -2;
        }
        else {
          bVar2 = ConsumeInteger(this,&local_c4,(ErrorMaker)ZEXT816(0x3438b4));
          if (!bVar2) {
            LocationRecorder::~LocationRecorder(&local_60);
            bVar2 = false;
            goto LAB_001cf002;
          }
        }
      }
      else {
        LocationRecorder::LocationRecorder(&local_60,&local_48,2);
        LocationRecorder::StartAt(&local_60,(Token *)local_98);
        LocationRecorder::EndAt(&local_60,(Token *)local_98);
        local_c4 = local_bc;
      }
      LocationRecorder::~LocationRecorder(&local_60);
      local_c4 = local_c4 + 1;
      *(int *)&local_a0[1].super_MessageLite._internal_metadata_.ptr_ = local_bc;
      *(int *)((long)&local_a0[1].super_MessageLite._internal_metadata_.ptr_ + 4) = local_c4;
      *(byte *)&local_a0[1].super_MessageLite._vptr_MessageLite =
           *(byte *)&local_a0[1].super_MessageLite._vptr_MessageLite | 3;
      bVar2 = true;
      local_c0 = 0;
    }
    else {
      bVar2 = false;
    }
LAB_001cf002:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,
                      CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1);
    }
    LocationRecorder::~LocationRecorder(&local_48);
    if (!bVar2) {
      return false;
    }
    text_01._M_str = ",";
    text_01._M_len = 1;
    bVar2 = TryConsume(this,text_01);
    if (!bVar2) {
      text_02._M_str = ";";
      text_02._M_len = 1;
      bVar2 = ConsumeEndOfDeclaration(this,text_02,local_b8);
      return bVar2;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(DescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    DescriptorProto::ReservedRange* range = message->add_reserved_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, DescriptorProto::ReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, (first ? "Expected field name or number range."
                                       : "Expected field number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}